

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServer.cxx
# Opt level: O3

void __thiscall cmDebugServer::Broadcast(cmDebugServer *this,string *msg)

{
  uv_rwlock_t *rwlock;
  pointer puVar1;
  cmConnection *pcVar2;
  int iVar3;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  pointer puVar4;
  
  rwlock = &(this->super_cmServerBase).ConnectionsMutex;
  uv_rwlock_rdlock(rwlock);
  puVar1 = (this->super_cmServerBase).Connections.
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->super_cmServerBase).Connections.
                super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    iVar3 = (*((puVar4->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl)->_vptr_cmConnection[4])();
    if ((char)iVar3 != '\0') {
      pcVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl;
      (**pcVar2->_vptr_cmConnection)(pcVar2,msg);
    }
  }
  uv_rwlock_rdunlock(rwlock);
  return;
}

Assistant:

void cmDebugServer::Broadcast(const std::string& msg)
{
  uv_rwlock_rdlock(&ConnectionsMutex);
  for (auto& connection : Connections) {
    if (connection->IsOpen()) {
      connection->WriteData(msg);
    }
  }
  uv_rwlock_rdunlock(&ConnectionsMutex);
}